

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDU_Factory.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::UTILS::PDU_Factory::applyFiltersBeforeDecodingPDUBody(PDU_Factory *this,Header *H)

{
  pointer ppPVar1;
  pointer ppPVar2;
  char cVar3;
  pointer ppPVar4;
  
  ppPVar1 = (this->m_vFilters).
            super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  ppPVar2 = (this->m_vFilters).
            super__Vector_base<KDIS::UTILS::PDU_Factory_Filter_*,_std::allocator<KDIS::UTILS::PDU_Factory_Filter_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  do {
    ppPVar4 = ppPVar2;
    if (ppPVar4 == ppPVar1) break;
    cVar3 = (**(code **)(*(long *)*ppPVar4 + 0x10))(*ppPVar4,H);
    ppPVar2 = ppPVar4 + 1;
  } while (cVar3 != '\0');
  return ppPVar4 == ppPVar1;
}

Assistant:

KBOOL PDU_Factory::applyFiltersBeforeDecodingPDUBody( const Header * H )
{
    // Test all the filters
    vector<PDU_Factory_Filter*>::const_iterator citr = m_vFilters.begin();
    vector<PDU_Factory_Filter*>::const_iterator citrEnd = m_vFilters.end();

    for (; citr != citrEnd; ++citr)
    {
        if (!(*citr)->ApplyFilterBeforeDecodingPDUBody(H))
        {
            return false;
        }
    }

    return true;
}